

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateBuilderMembers
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  Options *pOVar4;
  Semantic local_264;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_260;
  string_view local_258;
  string_view local_248;
  string_view local_238;
  Options local_228;
  Semantic local_1d4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d0;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  Options local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  Options local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  string_view local_a8;
  string_view local_98;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  ImmutablePrimitiveFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar3 = FieldDescriptor::has_presence(this->descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    java::Options::Options(&local_68,pOVar4);
    WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_68,false,false,false);
    java::Options::~Options(&local_68);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_88,
               "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_88[0]);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_98,local_a8,pFVar1,local_b0);
  }
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options(&local_108,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_108,false,false,false);
  java::Options::~Options(&local_108);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_128,local_138,pFVar1,local_140);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options(&local_198,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,SETTER,&local_198,true,false,false);
  java::Options::~Options(&local_198);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"}");
  pFVar1 = this->descriptor_;
  local_1d4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_1d0,&local_1d4);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1b8,local_1c8,pFVar1,local_1d0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options(&local_228,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_228,true,false,false);
  java::Options::~Options(&local_228);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_238,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_238);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"}");
  pFVar1 = this->descriptor_;
  local_264 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_260,&local_264);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_248,local_258,pFVar1,local_260);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return instance.has$capitalized_name$();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return instance.get$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
}